

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_radix_sort.h
# Opt level: O1

uint * crnlib::indirect_radix_sort<unsigned_int,unsigned_short>
                 (uint num_indices,uint *pIndices0,uint *pIndices1,unsigned_short *pKeys,
                 uint key_ofs,uint key_size,bool init_indices)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint *puVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint *puVar14;
  uint uVar15;
  uint offsets [256];
  uint hist [1024];
  uint auStack_1438 [256];
  int local_1038 [256];
  int aiStack_c38 [256];
  int aiStack_838 [256];
  int aiStack_438 [258];
  
  uVar4 = (ulong)key_ofs;
  if (init_indices) {
    puVar6 = pIndices0;
    if ((num_indices & 0xfffffffe) == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      do {
        *puVar6 = uVar5;
        puVar6[1] = uVar5 + 1;
        puVar6 = puVar6 + 2;
        uVar5 = uVar5 + 2;
      } while (puVar6 != pIndices0 + (num_indices & 0xfffffffe));
    }
    if ((num_indices & 1) != 0) {
      *puVar6 = uVar5;
    }
  }
  memset(local_1038,0,(ulong)key_size << 10);
  puVar6 = (uint *)0x0;
  switch(key_size) {
  case 1:
    puVar6 = pIndices0;
    if ((num_indices & 0xfffffffe) != 0) {
      do {
        bVar7 = *(byte *)((long)pKeys + (ulong)puVar6[1] * 2 + uVar4);
        local_1038[*(byte *)((long)pKeys + (ulong)*puVar6 * 2 + uVar4)] =
             local_1038[*(byte *)((long)pKeys + (ulong)*puVar6 * 2 + uVar4)] + 1;
        local_1038[bVar7] = local_1038[bVar7] + 1;
        puVar6 = puVar6 + 2;
      } while (puVar6 != pIndices0 + (num_indices & 0xfffffffe));
    }
    if ((num_indices & 1) != 0) {
      uVar5 = (uint)*(byte *)((long)pKeys + uVar4 + (ulong)*puVar6 * 2);
LAB_0019bec5:
      local_1038[uVar5] = local_1038[uVar5] + 1;
    }
    break;
  case 2:
    puVar6 = pIndices0;
    if ((num_indices & 0xfffffffe) != 0) {
      do {
        uVar5 = *(uint *)((long)pKeys + (ulong)*puVar6 * 2 + uVar4);
        uVar3 = *(uint *)((long)pKeys + (ulong)puVar6[1] * 2 + uVar4);
        local_1038[uVar5 & 0xff] = local_1038[uVar5 & 0xff] + 1;
        piVar1 = (int *)((long)aiStack_c38 + (ulong)(uVar5 >> 6 & 0x3fc));
        *piVar1 = *piVar1 + 1;
        local_1038[uVar3 & 0xff] = local_1038[uVar3 & 0xff] + 1;
        piVar1 = (int *)((long)aiStack_c38 + (ulong)(uVar3 >> 6 & 0x3fc));
        *piVar1 = *piVar1 + 1;
        puVar6 = puVar6 + 2;
      } while (puVar6 != pIndices0 + (num_indices & 0xfffffffe));
    }
    if ((num_indices & 1) != 0) {
      uVar5 = *(uint *)((long)pKeys + uVar4 + (ulong)*puVar6 * 2);
      local_1038[uVar5 & 0xff] = local_1038[uVar5 & 0xff] + 1;
      uVar5 = uVar5 >> 8 & 0xff | 0x100;
      goto LAB_0019bec5;
    }
    break;
  case 3:
    if (num_indices != 0) {
      lVar10 = 0;
      do {
        uVar5 = *(uint *)((long)pKeys + (ulong)*(uint *)((long)pIndices0 + lVar10) * 2 + uVar4);
        local_1038[uVar5 & 0xff] = local_1038[uVar5 & 0xff] + 1;
        piVar1 = (int *)((long)aiStack_c38 + (ulong)(uVar5 >> 6 & 0x3fc));
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)((long)aiStack_838 + (ulong)(uVar5 >> 0xe & 0x3fc));
        *piVar1 = *piVar1 + 1;
        lVar10 = lVar10 + 4;
      } while ((ulong)num_indices << 2 != lVar10);
    }
    break;
  case 4:
    if (num_indices != 0) {
      lVar10 = 0;
      do {
        uVar5 = *(uint *)((long)pKeys + (ulong)*(uint *)((long)pIndices0 + lVar10) * 2 + uVar4);
        local_1038[uVar5 & 0xff] = local_1038[uVar5 & 0xff] + 1;
        piVar1 = (int *)((long)aiStack_c38 + (ulong)(uVar5 >> 6 & 0x3fc));
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)((long)aiStack_838 + (ulong)(uVar5 >> 0xe & 0x3fc));
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)((long)aiStack_438 + (ulong)(uVar5 >> 0x16 & 0xfffffffc));
        *piVar1 = *piVar1 + 1;
        lVar10 = lVar10 + 4;
      } while ((ulong)num_indices << 2 != lVar10);
    }
    break;
  default:
    goto switchD_0019bcf8_default;
  }
  puVar6 = pIndices0;
  if (key_size != 0) {
    uVar12 = 0;
    do {
      puVar6 = pIndices1;
      uVar9 = (ulong)((uint)uVar12 & 0xffffff);
      uVar13 = 0xfffffffffffffffe;
      uVar5 = 0;
      do {
        auStack_1438[uVar13 + 2] = uVar5;
        iVar2 = local_1038[uVar9 * 0x100 + uVar13 + 2];
        auStack_1438[uVar13 + 3] = uVar5 + iVar2;
        uVar5 = uVar5 + iVar2 + local_1038[uVar9 * 0x100 + uVar13 + 3];
        uVar13 = uVar13 + 2;
      } while (uVar13 < 0xfe);
      bVar7 = (char)uVar12 * '\b';
      puVar14 = pIndices0;
      if ((ulong)(num_indices & 0xfffffffe) != 0) {
        do {
          uVar5 = *puVar14;
          uVar3 = puVar14[1];
          uVar11 = *(uint *)((long)pKeys + (ulong)uVar5 * 2 + uVar4) >> (bVar7 & 0x1f) & 0xff;
          uVar15 = *(uint *)((long)pKeys + (ulong)uVar3 * 2 + uVar4) >> (bVar7 & 0x1f) & 0xff;
          uVar8 = auStack_1438[uVar11];
          if (uVar11 == uVar15) {
            auStack_1438[uVar11] = uVar8 + 2;
            puVar6[uVar8] = uVar5;
            uVar11 = uVar8 + 1;
          }
          else {
            auStack_1438[uVar11] = uVar8 + 1;
            uVar11 = auStack_1438[uVar15];
            auStack_1438[uVar15] = uVar11 + 1;
            puVar6[uVar8] = uVar5;
          }
          puVar6[uVar11] = uVar3;
          puVar14 = puVar14 + 2;
        } while (puVar14 != pIndices0 + (num_indices & 0xfffffffe));
      }
      if ((num_indices & 1) != 0) {
        uVar5 = *puVar14;
        uVar8 = *(uint *)((long)pKeys + (ulong)uVar5 * 2 + uVar4) >> (bVar7 & 0x1f) & 0xff;
        uVar3 = auStack_1438[uVar8];
        auStack_1438[uVar8] = uVar3 + 1;
        puVar6[uVar3] = uVar5;
      }
      uVar12 = uVar12 + 1;
      pIndices1 = pIndices0;
      pIndices0 = puVar6;
    } while (uVar12 != key_size);
  }
switchD_0019bcf8_default:
  return puVar6;
}

Assistant:

T* indirect_radix_sort(uint num_indices, T* pIndices0, T* pIndices1, const Q* pKeys, uint key_ofs, uint key_size, bool init_indices) {
  CRNLIB_ASSERT_OPEN_RANGE(key_ofs, 0, sizeof(T));
  CRNLIB_ASSERT_CLOSED_RANGE(key_size, 1, 4);

  if (init_indices) {
    T* p = pIndices0;
    T* q = pIndices0 + (num_indices >> 1) * 2;
    uint i;
    for (i = 0; p != q; p += 2, i += 2) {
      p[0] = static_cast<T>(i);
      p[1] = static_cast<T>(i + 1);
    }

    if (num_indices & 1)
      *p = static_cast<T>(i);
  }

  uint hist[256 * 4];

  memset(hist, 0, sizeof(hist[0]) * 256 * key_size);

#define CRNLIB_GET_KEY(p) (*(const uint*)((const uint8*)(pKeys + *(p)) + key_ofs))
#define CRNLIB_GET_KEY_FROM_INDEX(i) (*(const uint*)((const uint8*)(pKeys + (i)) + key_ofs))

  if (key_size == 4) {
    T* p = pIndices0;
    T* q = pIndices0 + num_indices;
    for (; p != q; p++) {
      const uint key = CRNLIB_GET_KEY(p);

      hist[key & 0xFF]++;
      hist[256 + ((key >> 8) & 0xFF)]++;
      hist[512 + ((key >> 16) & 0xFF)]++;
      hist[768 + ((key >> 24) & 0xFF)]++;
    }
  } else if (key_size == 3) {
    T* p = pIndices0;
    T* q = pIndices0 + num_indices;
    for (; p != q; p++) {
      const uint key = CRNLIB_GET_KEY(p);

      hist[key & 0xFF]++;
      hist[256 + ((key >> 8) & 0xFF)]++;
      hist[512 + ((key >> 16) & 0xFF)]++;
    }
  } else if (key_size == 2) {
    T* p = pIndices0;
    T* q = pIndices0 + (num_indices >> 1) * 2;

    for (; p != q; p += 2) {
      const uint key0 = CRNLIB_GET_KEY(p);
      const uint key1 = CRNLIB_GET_KEY(p + 1);

      hist[key0 & 0xFF]++;
      hist[256 + ((key0 >> 8) & 0xFF)]++;

      hist[key1 & 0xFF]++;
      hist[256 + ((key1 >> 8) & 0xFF)]++;
    }

    if (num_indices & 1) {
      const uint key = CRNLIB_GET_KEY(p);

      hist[key & 0xFF]++;
      hist[256 + ((key >> 8) & 0xFF)]++;
    }
  } else {
    CRNLIB_ASSERT(key_size == 1);
    if (key_size != 1)
      return NULL;

    T* p = pIndices0;
    T* q = pIndices0 + (num_indices >> 1) * 2;

    for (; p != q; p += 2) {
      const uint key0 = CRNLIB_GET_KEY(p);
      const uint key1 = CRNLIB_GET_KEY(p + 1);

      hist[key0 & 0xFF]++;
      hist[key1 & 0xFF]++;
    }

    if (num_indices & 1) {
      const uint key = CRNLIB_GET_KEY(p);

      hist[key & 0xFF]++;
    }
  }

  T* pCur = pIndices0;
  T* pNew = pIndices1;

  for (uint pass = 0; pass < key_size; pass++) {
    const uint* pHist = &hist[pass << 8];

    uint offsets[256];

    uint cur_ofs = 0;
    for (uint i = 0; i < 256; i += 2) {
      offsets[i] = cur_ofs;
      cur_ofs += pHist[i];

      offsets[i + 1] = cur_ofs;
      cur_ofs += pHist[i + 1];
    }

    const uint pass_shift = pass << 3;

    T* p = pCur;
    T* q = pCur + (num_indices >> 1) * 2;

    for (; p != q; p += 2) {
      uint index0 = p[0];
      uint index1 = p[1];

      uint c0 = (CRNLIB_GET_KEY_FROM_INDEX(index0) >> pass_shift) & 0xFF;
      uint c1 = (CRNLIB_GET_KEY_FROM_INDEX(index1) >> pass_shift) & 0xFF;

      if (c0 == c1) {
        uint dst_offset0 = offsets[c0];

        offsets[c0] = dst_offset0 + 2;

        pNew[dst_offset0] = static_cast<T>(index0);
        pNew[dst_offset0 + 1] = static_cast<T>(index1);
      } else {
        uint dst_offset0 = offsets[c0]++;
        uint dst_offset1 = offsets[c1]++;

        pNew[dst_offset0] = static_cast<T>(index0);
        pNew[dst_offset1] = static_cast<T>(index1);
      }
    }

    if (num_indices & 1) {
      uint index = *p;
      uint c = (CRNLIB_GET_KEY_FROM_INDEX(index) >> pass_shift) & 0xFF;

      uint dst_offset = offsets[c];
      offsets[c] = dst_offset + 1;

      pNew[dst_offset] = static_cast<T>(index);
    }

    T* t = pCur;
    pCur = pNew;
    pNew = t;
  }

  return pCur;
}